

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void verb_prog_harness_crystal(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  OBJ_AFFECT_DATA *this;
  CHAR_DATA *in_RDX;
  char_data *in_RSI;
  long in_RDI;
  int efficiency;
  int mana;
  OBJ_AFFECT_DATA *oaf;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  int in_stack_ffffffffffffffdc;
  
  this = affect_find_obj(*(OBJ_AFFECT_DATA **)(in_RDI + 0x40),(int)gsn_fashion_crystal);
  if (this == (OBJ_AFFECT_DATA *)0x0) {
    send_to_char((char *)in_RSI,in_RDX);
    return;
  }
  if (this->owner == in_RSI) {
    iVar4 = 0x32;
  }
  else {
    char_data::Class(in_RSI);
    bVar1 = RString::operator==((RString *)this,
                                (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                                                ));
    if (!bVar1) {
      char_data::Class(in_RSI);
      bVar1 = RString::operator==((RString *)this,
                                  (char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8));
      if (!bVar1) {
        char_data::Class(in_RSI);
        bVar1 = RString::operator==((RString *)this,
                                    (char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                     in_stack_ffffffffffffffd8));
        if (!bVar1) {
          char_data::Class(in_RSI);
          bVar1 = RString::operator==((RString *)this,
                                      (char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                       in_stack_ffffffffffffffd8));
          if (!bVar1) {
            iVar4 = number_range((int)this,in_stack_ffffffffffffffdc);
            goto LAB_00668d48;
          }
        }
      }
    }
    iVar4 = number_range((int)this,in_stack_ffffffffffffffdc);
  }
LAB_00668d48:
  act((char *)in_RSI,in_RDX,this,(void *)CONCAT44(in_stack_ffffffffffffffdc,iVar4),0);
  act((char *)in_RSI,in_RDX,this,(void *)CONCAT44(in_stack_ffffffffffffffdc,iVar4),0);
  iVar2 = (int)this->modifier;
  extract_obj(_efficiency);
  if ((iVar4 < 0x15) && (iVar3 = number_percent(), 0x32 < iVar3)) {
    act((char *)in_RSI,in_RDX,this,(void *)CONCAT44(iVar2,iVar4),0);
  }
  else {
    act((char *)in_RSI,in_RDX,this,(void *)CONCAT44(iVar2,iVar4),0);
    in_RSI->mana = in_RSI->mana + (short)((iVar4 * iVar2) / 100);
    if ((double)(int)in_RSI->max_mana * 1.25 < (double)(int)in_RSI->mana) {
      in_RSI->mana = (short)(int)((double)(int)in_RSI->max_mana * 1.25);
    }
  }
  return;
}

Assistant:

void verb_prog_harness_crystal(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	OBJ_AFFECT_DATA *oaf;
	int mana, efficiency;

	oaf = affect_find_obj(obj->affected, gsn_fashion_crystal);

	if (!oaf)
	{
		send_to_char("This crystal is devoid of magical energy.\n\r", ch);
		return;
	}

	if (oaf->owner == ch)
	{
		efficiency = 50;
	}
	else if (ch->Class()->name == "sorcerer"
		|| ch->Class()->name == "shapeshifter"
		|| ch->Class()->name == "necromancer"
		|| ch->Class()->name == "chronomancer")
	{
		efficiency = number_range(25, 40);
	}
	else
	{
		efficiency = number_range(5, 20);
	}

	act("Focusing intently on the charged crystal, you harness the energy stored within.", ch, 0, 0, TO_CHAR);
	act("$n focuses intently on a glowing crystal in $s hands.", ch, 0, 0, TO_ROOM);

	mana = oaf->modifier;

	extract_obj(obj);

	if (efficiency <= 20 && number_percent() > 50)
	{
		act("The crystal crumbles into dust and the energy dissipates as your focus falters.", ch, 0, 0, TO_CHAR);
		return;
	}

	act("The crystal crumbles to dust as you harness the mana stored within.", ch, 0, 0, TO_CHAR);

	mana *= efficiency;
	mana /= 100;
	ch->mana += mana;

	if (ch->mana > (1.25 * ch->max_mana))
		ch->mana = (short)(ch->max_mana * 1.25);
}